

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ShaderProgram *this;
  Mat4<float,_void> *this_00;
  GLuint *pGVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  undefined1 handle [8];
  uint uVar5;
  GLuint depthProgram;
  GLuint GVar6;
  int iVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  long lVar10;
  undefined4 *puVar11;
  Vec3<float> *pVVar12;
  float fVar13;
  float fVar14;
  Vec3<float> VVar15;
  Vec3<float> color_00;
  Vec3<float> color_01;
  Vec3<float> vec;
  undefined1 local_648 [392];
  undefined8 uStack_4c0;
  undefined1 local_4b8 [8];
  Mat4<float,_void> cube_model;
  Model mainModel;
  Model floorModel;
  char *skybox_textures [6];
  undefined1 auStack_368 [8];
  Vec3<float> cube_positions [9];
  char *pcStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined4 local_2b0;
  undefined8 local_2ac;
  undefined8 uStack_2a4;
  undefined8 local_29c;
  undefined8 uStack_294;
  undefined1 auStack_288 [8];
  Mat4<float,_void> view;
  Vec3<float> atten_vec [9];
  float fStack_1d4;
  Mat4<float,_void> projection;
  undefined1 local_190 [8];
  SkyBox skybox;
  ZRender zrender;
  Mat4<float,_void> model;
  undefined1 local_f8 [8];
  Renderer render;
  double xPos;
  _Alloc_hider local_a0;
  double yPos;
  anon_union_12_3_e2189aaa_for_Vec3<float>_1 local_80;
  float fStack_74;
  float local_70 [2];
  float afStack_68 [2];
  float local_60 [2];
  float afStack_58 [2];
  float local_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  undefined4 *local_40;
  GLuint local_34;
  Vec3<float> color;
  
  uStack_4c0 = 0x10a09b;
  Render::CreateRenderer((Renderer *)local_f8,state.screen_width,state.screen_height);
  auStack_368 = (undefined1  [8])0x1a;
  cube_positions[0].field_0._0_8_ = anon_var_dwarf_38e3;
  stack0xfffffffffffffd08 = 0x1c;
  pcStack_2f0 = "./shader/model-fragment.glsl";
  uStack_4c0 = 0x10a0e2;
  ShaderProgram::ShaderProgram
            ((ShaderProgram *)(view.elements[3] + 2),(string_view *)auStack_368,
             (string_view *)((long)&cube_positions[8].field_0 + 8));
  render.shader_program.shader_program = atten_vec[0].field_0.field_0.r;
  render.vbo_offset = (uint)view.elements[3][2];
  render.max_allocated = (uint)view.elements[3][3];
  auStack_368 = (undefined1  [8])0x1f;
  cube_positions[0].field_0._0_8_ = anon_var_dwarf_391f;
  stack0xfffffffffffffd08 = 0x21;
  pcStack_2f0 = "./shader/light-cube-fragment.glsl";
  this = (ShaderProgram *)(view.elements[3] + 2);
  uStack_4c0 = 0x10a139;
  ShaderProgram::ShaderProgram
            (this,(string_view *)auStack_368,(string_view *)((long)&cube_positions[8].field_0 + 8));
  render.light_cube_shader_program.shader_program = atten_vec[0].field_0.field_0.r;
  render.shader_program.vertex_shader = (GLuint)view.elements[3][2];
  render.shader_program.fragment_shader = (GLuint)view.elements[3][3];
  auStack_368 = (undefined1  [8])0x1b;
  cube_positions[0].field_0._0_8_ = anon_var_dwarf_3951;
  stack0xfffffffffffffd08 = 0x1d;
  pcStack_2f0 = "./shader/skybox-fragment.glsl";
  uStack_4c0 = 0x10a183;
  ShaderProgram::ShaderProgram
            (this,(string_view *)auStack_368,(string_view *)((long)&cube_positions[8].field_0 + 8));
  render.skybox_shader_program.shader_program = atten_vec[0].field_0.field_0.r;
  render.light_cube_shader_program.vertex_shader = (GLuint)view.elements[3][2];
  render.light_cube_shader_program.fragment_shader = (GLuint)view.elements[3][3];
  uStack_4c0 = 0x10a199;
  stbi_set_flip_vertically_on_load(1);
  uStack_4c0 = 0x10a1ac;
  Model::Model((Model *)(cube_model.elements[3] + 2),"./Models/Final/rocket.obj");
  uStack_4c0 = 0x10a1bf;
  Model::Model((Model *)((long)&mainModel.directory.field_2 + 8),"./Models/Final/Floor/floor.obj");
  auStack_368 = (undefined1  [8])0x3ff71023400c454e;
  cube_positions[0].field_0._0_8_ = 0x400a3bf740101744;
  cube_positions._8_8_ = 0xbfca0e953ff2d384;
  cube_positions[1].field_0._4_8_ = 0x40a099ed3fa98d7a;
  cube_positions[2].field_0._0_8_ = 0xbf3f33ec4026a79c;
  cube_positions._32_8_ = 0x4009d36f3ff33f53;
  cube_positions[3].field_0._4_8_ = 0x3ff86152bf3482cf;
  cube_positions[4].field_0._0_8_ = 0x40c00000bfc53fd1;
  cube_positions._56_8_ = 0xc0c000003ee66666;
  cube_positions[5].field_0._4_8_ = 0x3ee66666c0c00000;
  cube_positions[6].field_0._0_8_ = 0xc0c0000040c00000;
  cube_positions._80_8_ = 0xc0c000003ee66666;
  cube_positions[7].field_0._4_8_ = 0x3ee6666640c00000;
  stack0xfffffffffffffd08 = 0x3f8000003f800000;
  pcStack_2f0 = (char *)0x3f800000;
  local_2e8 = 0x3e4ccccd;
  uStack_2e0 = 0x3f8000003f800000;
  local_2d8 = 0x3f8000003f800000;
  uStack_2d0 = 0;
  local_2c8 = 0x3f8000003f800000;
  uStack_2c0 = 0x3f8000003f800000;
  local_2b8 = 0x3f80000000000000;
  cube_positions[8].field_0.field_0.r = 6.0;
  local_2b0 = 0x3f800000;
  local_2ac = 0;
  uStack_2a4 = 0;
  local_29c = 0x3f8000003f800000;
  uStack_294 = 0x3f800000;
  local_40 = (undefined4 *)local_648;
  lVar10 = 0;
  do {
    Cube::Cube((Cube *)((long)local_40 + lVar10));
    lVar10 = lVar10 + 0x2c;
  } while (lVar10 != 0x18c);
  puVar8 = (undefined8 *)((long)local_40 + 0x1c);
  for (lVar10 = 0; lVar10 != 0x6c; lVar10 = lVar10 + 0xc) {
    *(undefined4 *)(puVar8 + -2) = *(undefined4 *)((long)&cube_positions[0].field_0 + lVar10);
    puVar8[-3] = *(undefined8 *)((long)cube_positions + lVar10 + -8);
    *(undefined8 *)((long)puVar8 + -0xc) = 0x3da3d70a3da3d70a;
    *(undefined4 *)((long)puVar8 + -4) = 0x3da3d70a;
    *puVar8 = *(undefined8 *)((long)&cube_positions[8].field_0 + lVar10 + 8);
    *(undefined4 *)(puVar8 + 1) = *(undefined4 *)((long)&pcStack_2f0 + lVar10);
    puVar8 = (undefined8 *)((long)puVar8 + 0x2c);
  }
  Render::ZRender::ZRender((ZRender *)&skybox.texture_ID,state.screen_width,state.screen_height);
  local_34 = (*glad_glCreateProgram)();
  view.elements[3][2] = 2.94273e-44;
  view.elements[3][3] = 0.0;
  atten_vec[0].field_0._0_8_ = anon_var_dwarf_39b5;
  GVar6 = CompileAndLogShader((string_view *)(view.elements[3] + 2),0x8b31);
  depthProgram = local_34;
  (*glad_glAttachShader)(local_34,GVar6);
  Render::ZRender::attachDepthFragment((ZRender *)&skybox.texture_ID,depthProgram);
  skybox_textures[3] = "./resources/skybox/back.png";
  skybox_textures[4] = "./resources/skybox/front.png";
  skybox_textures[1] = "./resources/skybox/top.png";
  skybox_textures[2] = "./resources/skybox/bottom.png";
  floorModel.directory.field_2._8_8_ = anon_var_dwarf_39ce;
  skybox_textures[0] = "./resources/skybox/left.png";
  SkyBox::SkyBox((SkyBox *)local_190);
  SkyBox::load_skybox_textures
            ((SkyBox *)local_190,(char **)((long)&floorModel.directory.field_2 + 8));
  (*glad_glUseProgram)(render.light_cube_shader_program.vertex_shader);
  update_uniform_1i("skybox",render.light_cube_shader_program.vertex_shader,0);
  FMath::Mat4<float,_void>::Mat4((Mat4<float,_void> *)&zrender.colorFBO,1.0);
  FMath::Mat4<float,_void>::Mat4((Mat4<float,_void> *)(skybox_textures + 5),1.0);
  stack0xfffffffffffffe28 = 0;
  FMath::Mat4<float,_void>::translate
            ((Mat4<float,_void> *)(view.elements[3] + 2),(Mat4<float,_void> *)&zrender.colorFBO,
             (Vec3<float> *)((long)&atten_vec[8].field_0 + 8));
  zrender.colorFBO = (GLuint)view.elements[3][2];
  zrender.activeDepth = (GLuint)view.elements[3][3];
  stack0xfffffffffffffe28 = 0x3e4ccccd3e4ccccd;
  FMath::Mat4<float,_void>::scale
            ((Mat4<float,_void> *)(view.elements[3] + 2),(Mat4<float,_void> *)&zrender.colorFBO,
             (Vec3<float> *)((long)&atten_vec[8].field_0 + 8));
  zrender.colorFBO = (GLuint)view.elements[3][2];
  zrender.activeDepth = (GLuint)view.elements[3][3];
  uVar4 = zrender._32_8_;
  zrender.colorFBO = view.elements[3][2];
  skybox_textures[5] = (char *)CONCAT44(skybox_textures[5]._4_4_,1.0 / (float)zrender.colorFBO);
  zrender._32_8_ = uVar4;
  FMath::Mat4<float,_void>::transpose
            ((Mat4<float,_void> *)(view.elements[3] + 2),(Mat4<float,_void> *)(skybox_textures + 5))
  ;
  skybox_textures[5] = (char *)view.elements[3]._8_8_;
  this_00 = (Mat4<float,_void> *)((long)&atten_vec[8].field_0 + 8);
  FMath::Mat4<float,_void>::Mat4(this_00,1.0);
  FMath::Mat4<float,_void>::perspective
            ((Mat4<float,_void> *)(view.elements[3] + 2),this_00,1.0,30.0,0.01,100.0);
  atten_vec[8].field_0._8_4_ = view.elements[3][2];
  fStack_1d4 = view.elements[3][3];
  (*glad_glEnable)(0xb44);
  std::chrono::_V2::steady_clock::now();
  view.elements[3][2] = 1.0;
  view.elements[3][3] = 0.44;
  atten_vec[0].field_0._0_8_ = 0x3f8000003eb33333;
  atten_vec._8_8_ = 0x3eb333333ee147ae;
  atten_vec[1].field_0._4_8_ = 0x3ee147ae3f800000;
  atten_vec[2].field_0._0_8_ = 0x3f8000003eb33333;
  atten_vec._32_8_ = 0x3eb333333ee147ae;
  atten_vec[3].field_0._4_8_ = 0x3ee147ae3f800000;
  atten_vec[4].field_0._0_8_ = 0x3dcccccd3eb33333;
  atten_vec._56_8_ = 0x3dcccccd3dcccccd;
  atten_vec[5].field_0._4_8_ = 0x3dcccccd3dcccccd;
  atten_vec[6].field_0._0_8_ = 0x3dcccccd3dcccccd;
  atten_vec._80_8_ = 0x3dcccccd3dcccccd;
  atten_vec[7].field_0._4_8_ = 0x3dcccccd3dcccccd;
  atten_vec[8].field_0.field_0.r = 0.1;
  local_40 = (undefined4 *)((long)local_40 + 0x24);
  while( true ) {
    iVar7 = glfwWindowShouldClose((GLFWwindow *)local_f8);
    if (iVar7 != 0) break;
    Render::ZRender::clearBG((ZRender *)&skybox.texture_ID,0.25,0.25,0.25,1.0);
    Render::ZRender::clearDepth((ZRender *)&skybox.texture_ID);
    (*glad_glUseProgram)(render.vbo_offset);
    FMath::Mat4<float,_void>::Mat4((Mat4<float,_void> *)auStack_288,1.0);
    FMath::Mat4<float,_void>::Mat4((Mat4<float,_void> *)local_4b8,1.0);
    Camera::ViewMatrix((Mat4<float,_void> *)&local_80.field_0,&state.camera);
    view.elements[0][1] = fStack_74;
    view.elements[0][0] = local_80.field_0.b;
    view.elements[2][2] = local_50;
    view.elements[2][3] = fStack_4c;
    view.elements[3][0] = fStack_48;
    view.elements[3][1] = fStack_44;
    view.elements[1][2] = local_60[0];
    view.elements[1][3] = local_60[1];
    view.elements[2][0] = afStack_58[0];
    view.elements[2][1] = afStack_58[1];
    view.elements[0][2] = local_70[0];
    view.elements[0][3] = local_70[1];
    view.elements[1][0] = afStack_68[0];
    view.elements[1][1] = afStack_68[1];
    auStack_288 = (undefined1  [8])local_80._0_8_;
    VVar15.field_0.field_0.b = state.camera.camera_pos.field_0.field_0.b;
    VVar15.field_0._0_8_ = state.camera.camera_pos.field_0._0_8_;
    update_uniform_3f("viewPos",render.vbo_offset,VVar15);
    pVVar12 = atten_vec;
    puVar11 = local_40;
    for (lVar10 = 0; lVar10 != 9; lVar10 = lVar10 + 1) {
      iVar7 = (int)lVar10;
      std::__cxx11::to_string((string *)&stack0xffffffffffffff60,iVar7);
      pGVar1 = &render.skybox_shader_program.vertex_shader;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar1,
                     "light[",(string *)&stack0xffffffffffffff60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_80.field_0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar1,
                     "].position");
      update_uniform_3f((char *)local_80._0_8_,render.vbo_offset,
                        (Vec3<float>)
                        ((anon_union_12_3_e2189aaa_for_Vec3<float>_1 *)(puVar11 + -8))->field_0);
      std::__cxx11::string::~string((string *)&local_80.field_0);
      std::__cxx11::string::~string((string *)pGVar1);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      std::__cxx11::to_string((string *)&stack0xffffffffffffff60,iVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar1,
                     "light[",(string *)&stack0xffffffffffffff60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_80.field_0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar1,
                     "].ambient");
      uVar4 = local_80._0_8_;
      uVar5 = render.vbo_offset;
      color.field_0.field_0.b = (float)*puVar11;
      color.field_0._0_8_ = *(undefined8 *)(puVar11 + -2);
      VVar15 = ambient(color);
      update_uniform_3f((char *)uVar4,uVar5,VVar15);
      std::__cxx11::string::~string((string *)&local_80.field_0);
      pGVar1 = &render.skybox_shader_program.vertex_shader;
      std::__cxx11::string::~string((string *)pGVar1);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      std::__cxx11::to_string((string *)&stack0xffffffffffffff60,iVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar1,
                     "light[",(string *)&stack0xffffffffffffff60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_80.field_0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar1,
                     "].diffuse");
      uVar4 = local_80._0_8_;
      uVar5 = render.vbo_offset;
      color_00.field_0.field_0.b = (float)*puVar11;
      color_00.field_0._0_8_ = *(undefined8 *)(puVar11 + -2);
      VVar15 = diffuse(color_00);
      update_uniform_3f((char *)uVar4,uVar5,VVar15);
      std::__cxx11::string::~string((string *)&local_80.field_0);
      pGVar1 = &render.skybox_shader_program.vertex_shader;
      std::__cxx11::string::~string((string *)pGVar1);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      std::__cxx11::to_string((string *)&stack0xffffffffffffff60,iVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar1,
                     "light[",(string *)&stack0xffffffffffffff60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_80.field_0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar1,
                     "].specular");
      uVar4 = local_80._0_8_;
      uVar5 = render.vbo_offset;
      color_01.field_0.field_0.b = (float)*puVar11;
      color_01.field_0._0_8_ = *(undefined8 *)(puVar11 + -2);
      VVar15 = specular(color_01);
      update_uniform_3f((char *)uVar4,uVar5,VVar15);
      std::__cxx11::string::~string((string *)&local_80.field_0);
      pGVar1 = &render.skybox_shader_program.vertex_shader;
      std::__cxx11::string::~string((string *)pGVar1);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      std::__cxx11::to_string((string *)&stack0xffffffffffffff60,iVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar1,
                     "light[",(string *)&stack0xffffffffffffff60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_80.field_0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar1,
                     "].constantAtten");
      update_uniform_1f((char *)local_80._0_8_,render.vbo_offset,pVVar12[-1].field_0.field_0.g);
      std::__cxx11::string::~string((string *)&local_80.field_0);
      std::__cxx11::string::~string((string *)pGVar1);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      std::__cxx11::to_string((string *)&stack0xffffffffffffff60,iVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar1,
                     "light[",(string *)&stack0xffffffffffffff60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_80.field_0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar1,
                     "].linearAtten");
      update_uniform_1f((char *)local_80._0_8_,render.vbo_offset,pVVar12[-1].field_0.field_0.b);
      std::__cxx11::string::~string((string *)&local_80.field_0);
      std::__cxx11::string::~string((string *)pGVar1);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      std::__cxx11::to_string((string *)&stack0xffffffffffffff60,iVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar1,
                     "light[",(string *)&stack0xffffffffffffff60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_80.field_0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pGVar1,
                     "].quadraticAtten");
      update_uniform_1f((char *)local_80._0_8_,render.vbo_offset,(pVVar12->field_0).field_0.r);
      std::__cxx11::string::~string((string *)&local_80.field_0);
      std::__cxx11::string::~string((string *)&render.skybox_shader_program.vertex_shader);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      pVVar12 = pVVar12 + 1;
      puVar11 = puVar11 + 0xb;
    }
    (*glad_glUseProgram)(render.vbo_offset);
    update_uniform_matrix_4f("model",render.vbo_offset,(float *)&zrender.colorFBO);
    update_uniform_matrix_4f("inv_model",render.vbo_offset,(float *)(skybox_textures + 5));
    update_uniform_matrix_4f("projection",render.vbo_offset,&atten_vec[8].field_0.field_0.b);
    update_uniform_matrix_4f("view",render.vbo_offset,(float *)auStack_288);
    (*glad_glUseProgram)(local_34);
    update_uniform_matrix_4f("model",local_34,(float *)&zrender.colorFBO);
    update_uniform_matrix_4f("projection",local_34,&atten_vec[8].field_0.field_0.b);
    update_uniform_matrix_4f("view",local_34,(float *)auStack_288);
    (*glad_glUseProgram)(render.light_cube_shader_program.vertex_shader);
    update_uniform_matrix_4f
              ("projection",render.light_cube_shader_program.vertex_shader,
               &atten_vec[8].field_0.field_0.b);
    update_uniform_matrix_4f
              ("view",render.light_cube_shader_program.vertex_shader,(float *)auStack_288);
    (*glad_glBindFramebuffer)(0x8d40,zrender.colorBuffer);
    SkyBox::draw_skybox((SkyBox *)local_190);
    (*glad_glUseProgram)(local_34);
    Render::ZRender::clearDepth((ZRender *)&skybox.texture_ID);
    Model::draw_model((Model *)(cube_model.elements[3] + 2),render.vbo_offset,local_34,
                      (ZRender *)&skybox.texture_ID);
    Model::draw_model((Model *)((long)&mainModel.directory.field_2 + 8),render.vbo_offset,local_34,
                      (ZRender *)&skybox.texture_ID);
    Render::ZRender::draw((ZRender *)&skybox.texture_ID);
    handle = local_f8;
    glfwGetCursorPos((GLFWwindow *)local_f8,(double *)&render.skybox_shader_program.vertex_shader,
                     (double *)&stack0xffffffffffffff60);
    if (state.first_mouse == true) {
      state.first_mouse = false;
      dVar3 = 0.0;
      dVar2 = 0.0;
    }
    else {
      dVar2 = state.last_xpos - (double)render.skybox_shader_program._4_8_;
      dVar3 = (double)local_a0._M_p - state.last_ypos;
    }
    state.last_xpos = (double)render.skybox_shader_program._4_8_;
    state.last_ypos = (double)local_a0._M_p;
    state.pitch = (float)((double)state.pitch - dVar3 * 0.001);
    state.yaw = (float)((double)state.yaw - dVar2 * 0.001);
    fVar14 = 1.5;
    if ((1.5 < state.pitch) || (fVar14 = -1.5, state.pitch < -1.5)) {
      state.pitch = fVar14;
    }
    fVar14 = sinf(state.yaw);
    fVar13 = cosf(state.pitch);
    state.camera.camera_front.field_0.field_0.r = fVar13 * fVar14;
    fVar14 = sinf(state.pitch);
    state.camera.camera_front.field_0.field_0.g = fVar14;
    fVar14 = cosf(state.pitch);
    fVar13 = cosf(state.yaw);
    state.camera.camera_front.field_0.field_0.b = fVar13 * -fVar14;
    VVar15 = FMath::Vec3<float>::unitVec((Vec3<float> *)&state);
    state.camera.camera_front.field_0.field_0.b = (float)VVar15.field_0._8_4_;
    state.camera.camera_front.field_0._0_8_ = VVar15.field_0._0_8_;
    dVar2 = glfwGetTime();
    dVar3 = (double)state.last_frame;
    state.last_frame = (float)dVar2;
    state.delta_time = (float)(dVar2 - dVar3);
    if (state.first_frame == true) {
      state.delta_time = 0.0;
      state.first_frame = false;
    }
    iVar7 = glfwGetKey((GLFWwindow *)handle,0x57);
    if (iVar7 == 1) {
      local_80.field_0.b = state.delta_time * state.camera.camera_front.field_0.field_0.b * 0.6;
      local_80._0_8_ =
           CONCAT44((float)((ulong)state.camera.camera_front.field_0._0_8_ >> 0x20) *
                    state.delta_time * 0.6,
                    (float)state.camera.camera_front.field_0._0_8_ * state.delta_time * 0.6);
      VVar15 = FMath::Vec3<float>::operator+
                         (&state.camera.camera_pos,(Vec3<float> *)&local_80.field_0);
      state.camera.camera_pos.field_0.field_0.b = (float)VVar15.field_0._8_4_;
      state.camera.camera_pos.field_0._0_8_ = VVar15.field_0._0_8_;
    }
    iVar7 = glfwGetKey((GLFWwindow *)handle,0x53);
    if (iVar7 == 1) {
      local_80.field_0.b = state.delta_time * state.camera.camera_front.field_0.field_0.b * 0.6;
      local_80._0_8_ =
           CONCAT44((float)((ulong)state.camera.camera_front.field_0._0_8_ >> 0x20) *
                    state.delta_time * 0.6,
                    (float)state.camera.camera_front.field_0._0_8_ * state.delta_time * 0.6);
      VVar15 = FMath::Vec3<float>::operator-
                         (&state.camera.camera_pos,(Vec3<float> *)&local_80.field_0);
      state.camera.camera_pos.field_0.field_0.b = (float)VVar15.field_0._8_4_;
      state.camera.camera_pos.field_0._0_8_ = VVar15.field_0._0_8_;
    }
    poVar9 = (ostream *)0x50;
    iVar7 = glfwGetKey((GLFWwindow *)handle,0x50);
    if (iVar7 == 1) {
      vec.field_0.field_0.b = state.camera.camera_pos.field_0.field_0.b;
      vec.field_0._0_8_ = state.camera.camera_pos.field_0._0_8_;
      poVar9 = FMath::operator<<((FMath *)&std::cout,poVar9,vec);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    std::chrono::_V2::steady_clock::now();
    glfwPollEvents();
    glfwSwapBuffers((GLFWwindow *)local_f8);
  }
  (*glad_glDeleteProgram)(render.vbo_offset);
  (*glad_glDeleteProgram)(render.shader_program.vertex_shader);
  (*glad_glDeleteProgram)(render.light_cube_shader_program.vertex_shader);
  Render::DestroyRenderer((Renderer *)local_f8);
  uStack_4c0 = 0x10af0b;
  Model::~Model((Model *)((long)&mainModel.directory.field_2 + 8));
  uStack_4c0 = 0x10af17;
  Model::~Model((Model *)(cube_model.elements[3] + 2));
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  auto render = Render::CreateRenderer(state.screen_width,state.screen_height);
  render.shader_program = ShaderProgram("./shader/model-vertex.glsl", "./shader/model-fragment.glsl");
  
  render.light_cube_shader_program = ShaderProgram("./shader/light-cube-vertex.glsl","./shader/light-cube-fragment.glsl");
  render.skybox_shader_program = ShaderProgram("./shader/skybox-vertex.glsl","./shader/skybox-fragment.glsl");

  stbi_set_flip_vertically_on_load(true);

  //Model mainModel("./models/cyborg/cyborg.obj");
  //Model mainModel("./models/rocket/rocket.obj");
  //  Model mainModel("./Models/cubie/cubie.obj");
   Model mainModel("./Models/Final/rocket.obj");
  //Model mainModel("./models/backpack/backpack.obj");
   Model floorModel("./Models/Final/Floor/floor.obj");
  
  FMath::Vec3<float> cube_positions[] = {
      //FMath::Vec3(0.6964f,  1.666f, 0.706876f),
      //FMath::Vec3(1.06075f, 1.01993f, -0.6604f),
      //FMath::Vec3(1.1641f, 1.01472f, 1.03914f),


      FMath::Vec3(2.19173f, 1.93018f, 2.25142f),
      FMath::Vec3(2.15991f, 1.89708f, -1.57857f),
      FMath::Vec3(1.32463f, 5.01879f, 2.60398f),
      FMath::Vec3(-0.746886f, 1.90037f, 2.15353f),
      FMath::Vec3(-0.705121f, 1.94047f, -1.54101f),

      // Lighting for four corners
      FMath::Vec3(6.0f,0.45f,-6.0f),
      FMath::Vec3(-6.0f,0.45f,6.0f),
      FMath::Vec3(-6.0f,0.45f,-6.0f),
      FMath::Vec3(6.0f,0.45f,6.0f),
  };

  
  FMath::Vec3<float> cube_colors[] = {
      //FMath::Vec3(1.0f, 1.0f, 1.0f),
      //FMath::Vec3(0.498f, 1.000f, 0.831f),
      //FMath::Vec3(0.863f, 0.078f, 0.235f),
      //FMath::Vec3(1.000f, 0.843f, 0.000f),
      
      FMath::Vec3(1.0f, 1.0f, 1.0f),
      FMath::Vec3(0.0f, 0.2f, 0.0f),
      FMath::Vec3(1.0f, 1.0f, 1.0f),
      FMath::Vec3(1.0f, 0.0f, 0.0f),
      FMath::Vec3(1.0f, 1.0f, 1.0f),

      FMath::Vec3(1.0f,0.0f,1.0f),
      FMath::Vec3(1.0f,0.0f,0.0f),
      FMath::Vec3(0.0f,0.0f,1.0f),
      FMath::Vec3(1.0f,1.0f,0.0f)
  };
  int NR_LIGHT_CUBES = sizeof(cube_positions) / (3 * sizeof(float));

  Cube cubes[NR_LIGHT_CUBES];
  for (int i = 0; i < NR_LIGHT_CUBES; i++){
    cubes[i].position = cube_positions[i];
    cubes[i].scale = FMath::Vec3<float>(0.08f, 0.08f, 0.08f);
    cubes[i].color = cube_colors[i];
  }

  // Manual depth buffering
  auto zrender = Render::ZRender(state.screen_width,state.screen_height);
  auto zprogram = glCreateProgram();
  auto zvertex  = CompileAndLogShader("./shader/zvertex.glsl",GL_VERTEX_SHADER);
  glAttachShader(zprogram,zvertex);
  zrender.attachDepthFragment(zprogram);
  
  
  const char* skybox_textures[6] = {
    "./resources/skybox/right.png",
    "./resources/skybox/left.png",
    "./resources/skybox/top.png",
    "./resources/skybox/bottom.png",
    "./resources/skybox/back.png",
    "./resources/skybox/front.png"
  };
  SkyBox skybox;
  skybox.load_skybox_textures(skybox_textures);
  glUseProgram(render.skybox_shader_program.shader_program);
  update_uniform_1i("skybox", render.skybox_shader_program.shader_program, 0);

  // glEnable(GL_DEPTH_TEST);

  //std::cout << "Width " << state.screen_width << " Height -> " << state.screen_height << std::endl;
  // pre-main loop optimization
  FMath::Mat4 model(1.0f), inverse_model(1.0f);
  model = model.translate({0.0f, 0.0f, 0.0f});
  model = model.scale({0.2f, 0.2f, 0.2});
  inverse_model = inverse_model.model_mat_inverse(model);
  inverse_model = inverse_model.transpose();

  // projection matrix does not change for us since it is only first person view
  FMath::Mat4 projection(1.0f);
  projection = projection.perspective(1.0f, 30.0f,0.01f,100.0f); // 30 degrees so 30.0f

  // auto project = glm::perspective(glm::radians(30.0f),1.0f,0.1f,10.0f);

  glEnable(GL_CULL_FACE);
  auto now = std::chrono::steady_clock::now();
  auto then = now;

  FMath::Vec3<float> atten_vec[9] =
    {
      FMath::Vec3(1.0f,0.44f,0.35f),
      FMath::Vec3(1.0f,0.44f,0.35f),
      FMath::Vec3(1.0f,0.44f,0.35f),
      FMath::Vec3(1.0f,0.44f,0.35f),
      FMath::Vec3(1.0f,0.44f,0.35f),
      
      FMath::Vec3(0.1f,0.1f,0.1f),
      FMath::Vec3(0.1f,0.1f,0.1f),
      FMath::Vec3(0.1f,0.1f,0.1f),
      FMath::Vec3(0.1f,0.1f,0.1f)
    };
      
  
  while (!glfwWindowShouldClose(render.window)) {


    zrender.clearBG(0.25f,0.25f,0.25f,1.0f);
    zrender.clearDepth();

    glUseProgram(render.shader_program.shader_program);
    FMath::Mat4 view(1.0f), cube_model(1.0f);

    view = state.camera.ViewMatrix();

    update_uniform_3f("viewPos", render.shader_program.shader_program,
                      state.camera.camera_pos);
    for (int i = 0; i < NR_LIGHT_CUBES; i++) {
      update_uniform_3f(
          std::string("light[" + std::to_string(i) + "].position").c_str(),
          render.shader_program.shader_program, cubes[i].position);

      update_uniform_3f(std::string("light[" + std::to_string(i) + "].ambient").c_str(), render.shader_program.shader_program,
                        ambient(cubes[i].color));
      update_uniform_3f(std::string("light[" + std::to_string(i) + "].diffuse").c_str(), render.shader_program.shader_program,
                        diffuse(cubes[i].color));
      update_uniform_3f(std::string("light[" + std::to_string(i) + "].specular").c_str(), render.shader_program.shader_program,
                        specular(cubes[i].color));

      // TODO: maybe use default values for this one? just an optimization thought
      // update_uniform_1f(std::string("light[" + std::to_string(i) + "].constantAtten").c_str(),
      //                   render.shader_program.shader_program, 1.0f);
      // update_uniform_1f(std::string("light[" + std::to_string(i) + "].linearAtten").c_str(),
      //                   render.shader_program.shader_program, 0.35f);
      // update_uniform_1f(std::string("light[" + std::to_string(i) + "].quadraticAtten").c_str(),
      //                   render.shader_program.shader_program, 0.44f);

      update_uniform_1f(std::string("light[" + std::to_string(i) + "].constantAtten").c_str(),
                        render.shader_program.shader_program, atten_vec[i].x);
      update_uniform_1f(std::string("light[" + std::to_string(i) + "].linearAtten").c_str(),
                        render.shader_program.shader_program, atten_vec[i].y);
      update_uniform_1f(std::string("light[" + std::to_string(i) + "].quadraticAtten").c_str(),
                        render.shader_program.shader_program, atten_vec[i].z);

    }


    glUseProgram(render.shader_program.shader_program);
    update_uniform_matrix_4f("model", render.shader_program.shader_program, &model[0][0]);
    update_uniform_matrix_4f("inv_model", render.shader_program.shader_program, &inverse_model[0][0]);
    update_uniform_matrix_4f("projection", render.shader_program.shader_program,projection.value_ptr());
    update_uniform_matrix_4f("view", render.shader_program.shader_program, &view[0][0]);

    
    glUseProgram(zprogram);
    update_uniform_matrix_4f("model", zprogram, model.value_ptr());
    update_uniform_matrix_4f("projection", zprogram, projection.value_ptr());//projection.value_ptr());
    update_uniform_matrix_4f("view", zprogram, view.value_ptr());
    
    


    glUseProgram(render.skybox_shader_program.shader_program);



    update_uniform_matrix_4f("projection", render.skybox_shader_program.shader_program, &projection[0][0]);
    update_uniform_matrix_4f("view", render.skybox_shader_program.shader_program, &view[0][0]);

    glBindFramebuffer(GL_FRAMEBUFFER,zrender.colorFBO);
    skybox.draw_skybox();
    
    glUseProgram(zprogram);

    zrender.clearDepth();
     
    // zrender.clearDepth();
    // // mainModel.draw_model(render.shader_program.shader_program);

    //  modal.draw_model(render.shader_program.shader_program,zprogram,zrender);
    mainModel.draw_model(render.shader_program.shader_program,zprogram,zrender);
    // update_uniform_matrix_4f("model", zprogram, model.scale({5.0f,1.0f,5.0f}).value_ptr());
    floorModel.draw_model(render.shader_program.shader_program,zprogram,zrender);
    // // // light cube render
    // // glUseProgram(render.light_cube_shader_program.shader_program);
    // // update_uniform_matrix_4f("projection", render.light_cube_shader_program.shader_program, &projection[0][0]);
    // // update_uniform_matrix_4f("view", render.light_cube_shader_program.shader_program, &view[0][0]);

    // // // TODO: use instanced cubes
    // // glBindVertexArray(cubes[0].VAO);
    // // for (int i = 0; i < NR_LIGHT_CUBES; i++){
    // //   cube_model = FMath::Mat4<float>(1.0f);
    // //   cube_model = cube_model.translate(cubes[i].position);
    // //   cube_model = cube_model.scale(cubes[i].scale);

    // //   update_uniform_3f("cubeColor", render.light_cube_shader_program.shader_program, cubes[i].color);
    // //   update_uniform_matrix_4f("model", render.light_cube_shader_program.shader_program, &cube_model[0][0]);
    // //   glDrawArrays(GL_TRIANGLES, 0, 36);
    // // }
    
    zrender.draw();

    handleEvents(render.window);
    now = std::chrono::steady_clock::now();
    //std::cout << "FPS is -> " << 1000.0f/std::chrono::duration_cast<std::chrono::milliseconds>(now-then).count() << std::endl;
    then = now;
    glfwPollEvents();
    glfwSwapBuffers(render.window);
  }

  glDeleteProgram(render.shader_program.shader_program);
  glDeleteProgram(render.light_cube_shader_program.shader_program);
  glDeleteProgram(render.skybox_shader_program.shader_program);
  Render::DestroyRenderer(&render);
  return 0;
}